

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptNumber::ToStringNanOrInfiniteOrZero(double value,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptLibrary *this;
  CharStringCache *this_00;
  JavascriptString *nanF;
  ScriptContext *scriptContext_local;
  double value_local;
  
  value_local = (double)ToStringNanOrInfinite(value,scriptContext);
  if ((JavascriptString *)value_local == (JavascriptString *)0x0) {
    bVar1 = IsZero(value);
    if (bVar1) {
      this = ScriptContext::GetLibrary(scriptContext);
      this_00 = JavascriptLibrary::GetCharStringCache(this);
      value_local = (double)CharStringCache::GetStringForCharA(this_00,'0');
    }
    else {
      value_local = 0.0;
    }
  }
  return (JavascriptString *)value_local;
}

Assistant:

JavascriptString* JavascriptNumber::ToStringNanOrInfiniteOrZero(double value, ScriptContext* scriptContext)
    {
        JavascriptString* nanF;
        if (nullptr != (nanF = ToStringNanOrInfinite(value, scriptContext)))
        {
            return nanF;
        }

        if (IsZero(value))
        {
            return scriptContext->GetLibrary()->GetCharStringCache().GetStringForCharA('0');
        }

        return nullptr;
    }